

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomThreeAction.cpp
# Opt level: O3

ActionResults * __thiscall GreenRoomThreeAction::Use(GreenRoomThreeAction *this)

{
  ItemTable *pIVar1;
  itemLocation iVar2;
  itemLocation iVar3;
  itemType iVar4;
  ItemWrapper *pIVar5;
  ActionResults *pAVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  itemType local_8c;
  itemType local_88 [2];
  string local_80;
  string local_60;
  string local_40;
  
  pIVar1 = (this->super_AbstractRoomAction).itemList;
  local_8c = Command::getMainItem((this->super_AbstractRoomAction).commands);
  pIVar5 = ItemTable::getValue(pIVar1,&local_8c);
  iVar2 = ItemWrapper::getLocation(pIVar5);
  if (iVar2 != BACKPACK) {
    local_88[1] = 0;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_88 + 1);
    iVar2 = ItemWrapper::getLocation(pIVar5);
    pIVar1 = (this->super_AbstractRoomAction).itemList;
    local_88[0] = Command::getMainItem((this->super_AbstractRoomAction).commands);
    pIVar5 = ItemTable::getValue(pIVar1,local_88);
    iVar3 = ItemWrapper::getLocation(pIVar5);
    if (iVar2 != iVar3) {
      pAVar6 = (ActionResults *)operator_new(0x30);
      paVar8 = &local_40.field_2;
      local_40._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"No item to use here","");
      ActionResults::ActionResults(pAVar6,CURRENT,&local_40);
      _Var7._M_p = local_40._M_dataplus._M_p;
      goto LAB_0011ec0d;
    }
  }
  iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (((iVar4 == BUCKET) &&
      (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands), iVar4 == BASIN))
     || ((iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands), iVar4 == BASIN &&
         (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands),
         iVar4 == BUCKET)))) {
    local_8c = BLOOD_BUCKET;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_8c);
    ItemWrapper::setLocation(pIVar5,INACTIVE);
    local_8c = CLEAN_BUCKET;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_8c);
    ItemWrapper::setLocation(pIVar5,ACTIVE);
    pAVar6 = (ActionResults *)operator_new(0x30);
    paVar8 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "You cleaned the bloody bucket! You now have a clean bucket filled with water!","");
    ActionResults::ActionResults(pAVar6,CURRENT,&local_60);
    _Var7._M_p = local_60._M_dataplus._M_p;
  }
  else {
    iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (((iVar4 != BASIN) &&
        (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands), iVar4 != BASIN)
        ) || ((iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands),
              iVar4 != CLEAN_BUCKET &&
              (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands),
              iVar4 != CLEAN_BUCKET)))) {
      pAVar6 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
      return pAVar6;
    }
    pAVar6 = (ActionResults *)operator_new(0x30);
    paVar8 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"You pour out and re-fill the bucket with ice-cold water","");
    ActionResults::ActionResults(pAVar6,CURRENT,&local_80);
    _Var7._M_p = local_80._M_dataplus._M_p;
  }
LAB_0011ec0d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p);
  }
  return pAVar6;
}

Assistant:

ActionResults *GreenRoomThreeAction::Use() {

    if(!(itemList->getValue(commands->getMainItem())->getLocation() == BACKPACK || itemList->getValue(PLAYER)->getLocation() == itemList->getValue(commands->getMainItem())->getLocation()))
    {
        return new ActionResults(CURRENT, "No item to use here");
    }

    if((commands->getMainItem() == BUCKET && commands->getActedOnItem() == BASIN) ||
            (commands->getMainItem() == BASIN && commands->getActedOnItem() == BUCKET)) {

        itemList->getValue(BLOOD_BUCKET)->setLocation(INACTIVE);
        itemList->getValue(CLEAN_BUCKET)->setLocation(ACTIVE);
        return new ActionResults(CURRENT, "You cleaned the bloody bucket! You now have a clean bucket filled with water!");
    }
    else if ((commands->getMainItem() == BASIN || commands->getActedOnItem() == BASIN) &&
                                                         (commands->getMainItem() == CLEAN_BUCKET || commands->getActedOnItem() == CLEAN_BUCKET))
    {
        return new ActionResults(CURRENT,"You pour out and re-fill the bucket with ice-cold water");
    } else {
        return AbstractRoomAction::Use();
    }
}